

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

vector<const_char_*,_std::allocator<const_char_*>_> * __thiscall
spvtools::Optimizer::GetPassNames
          (vector<const_char_*,_std::allocator<const_char_*>_> *__return_storage_ptr__,
          Optimizer *this)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  pointer pIVar4;
  Pass *pPVar5;
  undefined4 extraout_var;
  value_type local_28;
  uint local_20;
  undefined1 local_19;
  uint32_t i;
  Optimizer *this_local;
  vector<const_char_*,_std::allocator<const_char_*>_> *v;
  
  local_19 = 0;
  _i = this;
  this_local = (Optimizer *)__return_storage_ptr__;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(__return_storage_ptr__);
  local_20 = 0;
  while( true ) {
    uVar1 = local_20;
    pIVar4 = std::
             unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
             ::operator->(&this->impl_);
    uVar2 = opt::PassManager::NumPasses(&pIVar4->pass_manager);
    if (uVar2 <= uVar1) break;
    pIVar4 = std::
             unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
             ::operator->(&this->impl_);
    pPVar5 = opt::PassManager::GetPass(&pIVar4->pass_manager,local_20);
    iVar3 = (*pPVar5->_vptr_Pass[2])();
    local_28 = (value_type)CONCAT44(extraout_var,iVar3);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (__return_storage_ptr__,&local_28);
    local_20 = local_20 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const char*> Optimizer::GetPassNames() const {
  std::vector<const char*> v;
  for (uint32_t i = 0; i < impl_->pass_manager.NumPasses(); i++) {
    v.push_back(impl_->pass_manager.GetPass(i)->name());
  }
  return v;
}